

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::PrimRect(ImDrawList *this,ImVec2 *a,ImVec2 *c,ImU32 col)

{
  ImVec2 IVar1;
  ImDrawIdx IVar2;
  ImDrawIdx idx;
  ImVec2 uv;
  ImVec2 d;
  ImVec2 b;
  ImU32 col_local;
  ImVec2 *c_local;
  ImVec2 *a_local;
  ImDrawList *this_local;
  
  ImVec2::ImVec2(&d,c->x,a->y);
  ImVec2::ImVec2(&uv,a->x,c->y);
  IVar1 = this->_Data->TexUvWhitePixel;
  IVar2 = (ImDrawIdx)this->_VtxCurrentIdx;
  *this->_IdxWritePtr = IVar2;
  this->_IdxWritePtr[1] = IVar2 + 1;
  this->_IdxWritePtr[2] = IVar2 + 2;
  this->_IdxWritePtr[3] = IVar2;
  this->_IdxWritePtr[4] = IVar2 + 2;
  this->_IdxWritePtr[5] = IVar2 + 3;
  this->_VtxWritePtr->pos = *a;
  this->_VtxWritePtr->uv = IVar1;
  this->_VtxWritePtr->col = col;
  this->_VtxWritePtr[1].pos = d;
  this->_VtxWritePtr[1].uv = IVar1;
  this->_VtxWritePtr[1].col = col;
  this->_VtxWritePtr[2].pos = *c;
  this->_VtxWritePtr[2].uv = IVar1;
  this->_VtxWritePtr[2].col = col;
  this->_VtxWritePtr[3].pos = uv;
  this->_VtxWritePtr[3].uv = IVar1;
  this->_VtxWritePtr[3].col = col;
  this->_VtxWritePtr = this->_VtxWritePtr + 4;
  this->_VtxCurrentIdx = this->_VtxCurrentIdx + 4;
  this->_IdxWritePtr = this->_IdxWritePtr + 6;
  return;
}

Assistant:

void ImDrawList::PrimRect(const ImVec2& a, const ImVec2& c, ImU32 col)
{
    ImVec2 b(c.x, a.y), d(a.x, c.y), uv(_Data->TexUvWhitePixel);
    ImDrawIdx idx = (ImDrawIdx)_VtxCurrentIdx;
    _IdxWritePtr[0] = idx; _IdxWritePtr[1] = (ImDrawIdx)(idx+1); _IdxWritePtr[2] = (ImDrawIdx)(idx+2);
    _IdxWritePtr[3] = idx; _IdxWritePtr[4] = (ImDrawIdx)(idx+2); _IdxWritePtr[5] = (ImDrawIdx)(idx+3);
    _VtxWritePtr[0].pos = a; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
    _VtxWritePtr[1].pos = b; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
    _VtxWritePtr[2].pos = c; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col;
    _VtxWritePtr[3].pos = d; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col;
    _VtxWritePtr += 4;
    _VtxCurrentIdx += 4;
    _IdxWritePtr += 6;
}